

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O1

void TPZFMatrix<long_double>::MultAdd
               (longdouble *ptr,int64_t rows,int64_t cols,TPZFMatrix<long_double> *x,
               TPZFMatrix<long_double> *y,TPZFMatrix<long_double> *z,longdouble alpha,
               longdouble beta,int opt)

{
  longdouble lVar1;
  long lVar2;
  longdouble *plVar3;
  ulong uVar4;
  long lVar5;
  size_t sVar6;
  longdouble *plVar7;
  longdouble *plVar8;
  char *msg1;
  longdouble *plVar9;
  ulong uVar10;
  int64_t c;
  long lVar11;
  long lVar12;
  longdouble lVar13;
  long local_68;
  
  lVar2 = (x->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow;
  msg1 = "TPZFMatrix::MultAdd matrix x with incompatible dimensions>";
  if (opt == 0) {
    if (lVar2 != cols) goto LAB_00be5024;
  }
  else if (lVar2 != rows) goto LAB_00be5024;
  if ((beta != (longdouble)0) || (NAN(beta) || NAN((longdouble)0))) {
    lVar2 = (y->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow;
    if (opt == 0) {
      if (lVar2 == rows) goto LAB_00be4c99;
    }
    else if (lVar2 == cols) {
LAB_00be4c99:
      if ((y->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol ==
          (x->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol) goto LAB_00be4cad;
    }
    msg1 = "TPZFMatrix::MultAdd matrix y with incompatible dimensions>";
LAB_00be5024:
    Error(msg1,(char *)0x0);
    return;
  }
LAB_00be4cad:
  lVar2 = (z->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow;
  lVar12 = (z->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol;
  lVar11 = (x->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol;
  if (opt == 0) {
    uVar4 = rows;
    if (lVar2 == rows && lVar12 == lVar11) goto LAB_00be4cec;
  }
  else {
    uVar4 = cols;
    if (lVar2 == cols && lVar12 == lVar11) goto LAB_00be4cec;
  }
  (*(z->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xe])
            (z,uVar4);
LAB_00be4cec:
  if (cols != 0 && rows != 0) {
    lVar2 = (x->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol;
    if (0 < lVar2) {
      uVar4 = uVar4 & 0xffffffff;
      local_68 = 0;
      lVar12 = 0;
      do {
        if (((z->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow < 1) ||
           ((z->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol <= lVar12)) {
          Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        lVar11 = (z->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow;
        plVar3 = z->fElem;
        if ((beta != (longdouble)0) || (NAN(beta) || NAN((longdouble)0))) {
          if (z != y) {
            memcpy(plVar3 + lVar11 * lVar12,
                   y->fElem + (y->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow * lVar12,
                   uVar4 << 4);
          }
          if (uVar4 != 0) {
            uVar10 = 0;
            do {
              lVar11 = 0;
              do {
                if (((z->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow <= (long)uVar10) ||
                   ((z->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol <= lVar11)) {
                  Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                lVar5 = (z->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow * lVar11;
                z->fElem[lVar5 + uVar10] = beta * z->fElem[lVar5 + uVar10];
                lVar11 = lVar11 + 1;
              } while (lVar2 != lVar11);
              uVar10 = uVar10 + 1;
            } while (uVar10 != uVar4);
          }
        }
        else if (uVar4 != 0) {
          sVar6 = 0;
          do {
            *(longdouble *)((long)plVar3 + sVar6 + lVar11 * local_68) = (longdouble)0;
            sVar6 = sVar6 + 0x10;
          } while (uVar4 << 4 != sVar6);
        }
        lVar12 = lVar12 + 1;
        local_68 = local_68 + 0x10;
      } while (lVar12 != lVar2);
    }
    if (0 < lVar2) {
      lVar12 = 0;
      do {
        if (opt == 0) {
          if (0 < cols) {
            lVar11 = 0;
            do {
              if (((z->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow < 1) ||
                 ((z->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol <= lVar12)) {
                Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              if (0 < rows) {
                plVar7 = z->fElem +
                         (z->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow * lVar12;
                lVar5 = (x->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow;
                plVar9 = x->fElem;
                plVar3 = plVar7 + rows;
                plVar8 = ptr + lVar11 * rows;
                do {
                  lVar13 = *plVar8;
                  plVar8 = plVar8 + 1;
                  *plVar7 = *plVar7 + plVar9[lVar5 * lVar12 + lVar11] * lVar13 * alpha;
                  plVar7 = plVar7 + 1;
                } while (plVar7 < plVar3);
              }
              lVar11 = lVar11 + 1;
            } while (lVar11 != cols);
          }
        }
        else {
          if (((z->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow < 1) ||
             ((z->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol <= lVar12)) {
            Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          if (0 < cols) {
            plVar7 = z->fElem + (z->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow * lVar12;
            lVar11 = (x->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow;
            plVar3 = x->fElem;
            lVar5 = 0;
            plVar9 = ptr;
            do {
              if (rows < 1) {
                lVar13 = (longdouble)0;
              }
              else {
                lVar13 = (longdouble)0;
                plVar8 = plVar3 + lVar11 * lVar12;
                do {
                  lVar1 = *plVar9;
                  plVar9 = plVar9 + 1;
                  lVar13 = *plVar8 * lVar1 + lVar13;
                  plVar8 = plVar8 + 1;
                } while (plVar8 < plVar3 + lVar11 * lVar12 + rows);
              }
              *plVar7 = *plVar7 + alpha * lVar13;
              plVar7 = plVar7 + 1;
              lVar5 = lVar5 + 1;
            } while (lVar5 != cols);
          }
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 != lVar2);
    }
  }
  return;
}

Assistant:

void TPZFMatrix<TVar>::MultAdd(const TVar *ptr, int64_t rows, int64_t cols, const TPZFMatrix<TVar> &x,const TPZFMatrix<TVar> &y, TPZFMatrix<TVar> &z,
                               const TVar alpha,const TVar beta ,const int opt)
{
    
    
    if ((!opt && cols != x.Rows()) || (opt && rows != x.Rows())) {
        Error( "TPZFMatrix::MultAdd matrix x with incompatible dimensions>" );
        return;
    }
    if(beta != (TVar)0. && ((!opt && rows != y.Rows()) || (opt && cols != y.Rows()) || y.Cols() != x.Cols())) {
        Error( "TPZFMatrix::MultAdd matrix y with incompatible dimensions>" );
        return;
    }
    if(!opt) {
        if(z.Cols() != x.Cols() || z.Rows() != rows) {
            z.Redim(rows,x.Cols());
        }
    } else {
        if(z.Cols() != x.Cols() || z.Rows() != cols) {
            z.Redim(cols,x.Cols());
        }
    }
    unsigned numeq = opt ? cols : rows;
    int64_t xcols = x.Cols();
    int64_t ic, c;
    if(!(rows*cols)) return;
    for (ic = 0; ic < xcols; ic++) {
        TVar *zp = &z(0,ic), *zlast = zp+numeq;
        if(beta != (TVar)0.) {
            const TVar *yp = &y.g(0,ic);
            if(&z != &y) {
                memcpy((void *)zp,(void *)yp,numeq*sizeof(TVar));
            }
            for(int64_t i=0; i< numeq; i++) for(int64_t c=0; c<xcols; c++) z(i,c) *= beta;
        } else {
            while(zp != zlast) {
                *zp = 0.;
                zp ++;
            }
        }
    }
    
    
    for (ic = 0; ic < xcols; ic++) {
        if(!opt) {
            for ( c = 0; c<cols; c++) {
                TVar * zp = &z(0,ic), *zlast = zp+rows;
                const TVar * fp = ptr +rows*c;
                const TVar * xp = &x.g(c,ic);
                while(zp < zlast) {
                    *zp += alpha* *fp++ * *xp;
                    zp ++;
                }
            }
        } else {
            const TVar * fp = ptr;
            TVar *zp = &z(0,ic);
            for (c = 0; c<cols; c++) {
                TVar val = 0.;
                // bug correction philippe 5/2/97
                //					 REAL * xp = &x(0,ic), xlast = xp + numeq;
                const TVar *xp = &x.g(0,ic);
                const TVar *xlast = xp + rows;
                while(xp < xlast) {
                    val += *fp++ * *xp;
                    xp ++;
                }
                *zp += alpha *val;
                zp ++;
            }
        }
    }
    
    
    
    
    
}